

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  WirePointer *pWVar1;
  uint uVar2;
  SegmentReader *pSVar3;
  word *pwVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  WirePointer *pWVar8;
  PointerType PVar9;
  long lVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  Fault f;
  Fault local_38;
  undefined8 *puVar6;
  
  pWVar14 = this->pointer;
  PVar9 = NULL_;
  if (pWVar14 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar2 = (pWVar14->offsetAndKind).value;
  if ((pWVar14->field_1).upper32Bits == 0 && uVar2 == 0) {
    return NULL_;
  }
  pSVar3 = this->segment;
  pWVar12 = pWVar14 + 1;
  lVar10 = (long)((int)uVar2 >> 2);
  if (pSVar3 == (SegmentReader *)0x0) {
    pWVar8 = pWVar12 + lVar10;
  }
  else {
    pwVar4 = (pSVar3->ptr).ptr;
    pWVar8 = (WirePointer *)(pwVar4 + (pSVar3->ptr).size_);
    if (((long)pwVar4 - (long)pWVar12 >> 3 <= lVar10) &&
       (lVar10 <= (long)pWVar8 - (long)pWVar12 >> 3)) {
      pWVar8 = pWVar12 + lVar10;
    }
  }
  if ((uVar2 & 3) != 2 || pSVar3 == (SegmentReader *)0x0) goto LAB_0014f64c;
  iVar5 = (*pSVar3->arena->_vptr_Arena[2])();
  puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar5);
  if (puVar6 == (undefined8 *)0x0) {
    getPointerType();
  }
  else {
    uVar2 = (pWVar14->offsetAndKind).value;
    uVar11 = (ulong)(uVar2 >> 3);
    uVar7 = puVar6[3];
    if ((long)uVar7 < (long)uVar11) {
      uVar11 = uVar7;
    }
    uVar13 = 2 - (ulong)((uVar2 & 4) == 0);
    if (uVar11 + uVar13 <= uVar7) {
      pWVar12 = (WirePointer *)(uVar11 * 8 + puVar6[2]);
      uVar7 = *(ulong *)puVar6[4];
      if (uVar13 <= uVar7) {
        *(ulong *)puVar6[4] = uVar7 - uVar13;
        pWVar1 = pWVar12 + 1;
        if (((pWVar14->offsetAndKind).value & 4) == 0) {
          lVar10 = (long)((int)(pWVar12->offsetAndKind).value >> 2);
          pWVar8 = (WirePointer *)(puVar6[2] + puVar6[3] * 8);
          pWVar14 = pWVar12;
          if ((puVar6[2] - (long)pWVar1 >> 3 <= lVar10) &&
             (lVar10 <= (long)pWVar8 - (long)pWVar1 >> 3)) {
            pWVar8 = pWVar1 + lVar10;
          }
        }
        else {
          lVar10 = (**(code **)(*(long *)*puVar6 + 0x10))
                             ((long *)*puVar6,(pWVar12->field_1).upper32Bits);
          pWVar14 = pWVar1;
          if (lVar10 == 0) {
            getPointerType();
          }
          else {
            uVar2 = (pWVar12->offsetAndKind).value;
            if ((uVar2 & 3) == 2) {
              uVar7 = (ulong)(uVar2 >> 3);
              if ((long)*(ulong *)(lVar10 + 0x18) < (long)uVar7) {
                uVar7 = *(ulong *)(lVar10 + 0x18);
              }
              pWVar8 = (WirePointer *)(uVar7 * 8 + *(long *)(lVar10 + 0x10));
              goto LAB_0014f64c;
            }
            getPointerType();
          }
          pWVar8 = (WirePointer *)0x0;
        }
        goto LAB_0014f64c;
      }
      (**(code **)(*(long *)*puVar6 + 0x18))();
    }
    getPointerType();
  }
  pWVar8 = (WirePointer *)0x0;
LAB_0014f64c:
  if (pWVar8 != (WirePointer *)0x0) {
    uVar2 = (pWVar14->offsetAndKind).value;
    switch(uVar2 & 3) {
    case 0:
      PVar9 = STRUCT;
      break;
    case 1:
      PVar9 = LIST;
      break;
    case 2:
      PVar9 = NULL_;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xaad,FAILED,(char *)0x0,"\"far pointer not followed?\"",
                 (char (*) [26])"far pointer not followed?");
      kj::_::Debug::Fault::~Fault(&local_38);
      break;
    case 3:
      PVar9 = CAPABILITY;
      if (uVar2 != 3) {
        getPointerType();
        PVar9 = NULL_;
      }
    }
  }
  return PVar9;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == nullptr) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}